

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (0 < outw) {
    pfVar3 = alpha + 3;
    uVar4 = 0;
    do {
      fVar7 = ((float)(int)uVar4 + 0.5) * (float)w * (1.0 / (float)outw) + -0.5;
      fVar5 = floorf(fVar7);
      iVar1 = (int)fVar5;
      fVar7 = fVar7 - (float)(int)fVar5;
      fVar5 = fVar7 + 1.0;
      fVar6 = 1.0 - fVar7;
      fVar5 = (3.75 - fVar5 * 0.75) * fVar5 * fVar5 + fVar5 * -6.0 + 3.0;
      fVar7 = (fVar7 * 1.25 + -2.25) * fVar7 * fVar7 + 1.0;
      *(ulong *)(pfVar3 + -3) = CONCAT44(fVar7,fVar5);
      fVar6 = (fVar6 * 1.25 + -2.25) * fVar6 * fVar6;
      pfVar3[-1] = fVar6 + 1.0;
      *pfVar3 = -(fVar6 + fVar5 + fVar7);
      if (iVar1 < 0) {
        pfVar2 = alpha + uVar4 * 4 + 3;
        fVar5 = 1.0 - *pfVar3;
        pfVar3[-3] = fVar5;
        pfVar3[-2] = *pfVar3;
        pfVar3[-1] = 0.0;
LAB_00163835:
        *pfVar2 = 0.0;
        iVar1 = 1;
      }
      else if (iVar1 == 0) {
        fVar5 = fVar5 + pfVar3[-2];
        pfVar3[-3] = fVar5;
        *(undefined8 *)(pfVar3 + -2) = *(undefined8 *)(pfVar3 + -1);
        pfVar2 = pfVar3;
        goto LAB_00163835;
      }
      if (iVar1 == w + -2) {
        *pfVar3 = *pfVar3 + pfVar3[-1];
        pfVar3[-1] = pfVar3[-2];
        pfVar3[-2] = fVar5;
LAB_0016387f:
        pfVar3[-3] = 0.0;
        iVar1 = w + -3;
      }
      else if (w + -1 <= iVar1) {
        *pfVar3 = 1.0 - fVar5;
        pfVar3[-1] = fVar5;
        pfVar3[-2] = 0.0;
        goto LAB_0016387f;
      }
      xofs[uVar4] = iVar1;
      uVar4 = uVar4 + 1;
      pfVar3 = pfVar3 + 4;
    } while ((uint)outw != uVar4);
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha)
{
    double scale = (double)w / outw;

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx*4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx*4 +0] = 1.f - alpha[dx*4 +3];
            alpha[dx*4 +1] = alpha[dx*4 +3];
            alpha[dx*4 +2] = 0.f;
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx*4 +0] = alpha[dx*4 +0] + alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +2];
            alpha[dx*4 +2] = alpha[dx*4 +3];
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx*4 +3] = alpha[dx*4 +2] + alpha[dx*4 +3];
            alpha[dx*4 +2] = alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +0];
            alpha[dx*4 +0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx*4 +3] = 1.f - alpha[dx*4 +0];
            alpha[dx*4 +2] = alpha[dx*4 +0];
            alpha[dx*4 +1] = 0.f;
            alpha[dx*4 +0] = 0.f;
        }

        xofs[dx] = sx;
    }
}